

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getColUnscaled(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp,int i,
                DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vec)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  cpp_dec_float<50U,_int,_void> *in_RCX;
  int in_EDX;
  int __c;
  int __c_00;
  long in_RSI;
  int j;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int exp2;
  int exp1;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffec8;
  cpp_dec_float<50U,_int,_void> *f;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffed0;
  cpp_dec_float<50U,_int,_void> *this_00;
  uint i_00;
  cpp_dec_float<50U,_int,_void> *this_01;
  int in_stack_fffffffffffffeec;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff0c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff10;
  undefined1 local_dc [56];
  undefined1 local_a4 [56];
  uint local_6c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_68;
  int local_60;
  int local_5c;
  cpp_dec_float<50U,_int,_void> *local_58;
  DataArray<int> *local_50;
  cpp_dec_float<50U,_int,_void> *local_48;
  int local_3c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_50 = (DataArray<int> *)(in_RSI + 0x178);
  local_58 = (cpp_dec_float<50U,_int,_void> *)(in_RSI + 0xb0);
  local_48 = in_RCX;
  local_3c = in_EDX;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::colVector((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  iVar1 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  piVar2 = DataArray<int>::operator[](local_50,local_3c);
  local_60 = *piVar2;
  local_68 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::colVector(in_stack_fffffffffffffed0,iVar1);
  this_01 = local_48;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::size(local_68);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3b20d3);
  local_6c = 0;
  while( true ) {
    i_00 = local_6c;
    iVar1 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size(local_68);
    if (iVar1 <= (int)i_00) break;
    f = local_58;
    pcVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index(local_68,(char *)(ulong)local_6c,__c);
    piVar2 = DataArray<int>::operator[]((DataArray<int> *)f,(int)pcVar3);
    local_5c = *piVar2;
    this_00 = local_48;
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::index(local_68,(char *)(ulong)local_6c,__c_00);
    local_28 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value(local_68,local_6c);
    local_20 = &stack0xfffffffffffffeec;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,f);
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    local_10 = local_a4;
    local_18 = local_dc;
    local_8 = local_18;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,f);
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this_01,i_00,
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)this_00);
    local_6c = local_6c + 1;
  }
  return;
}

Assistant:

void SPxScaler<R>::getColUnscaled(const SPxLPBase<R>& lp, int i, DSVectorBase<R>& vec) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);
   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   vec = lp.LPColSetBase<R>::colVector(i);

   int exp1;
   int exp2 = colscaleExp[i];

   const SVectorBase<R>& col = lp.colVector(i);
   vec.setMax(col.size());
   vec.clear();

   for(int j = 0; j < col.size(); j++)
   {
      exp1 = rowscaleExp[col.index(j)];
      vec.add(col.index(j), spxLdexp(col.value(j), -exp1 - exp2));
   }
}